

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  int iVar3;
  ulong uVar4;
  ctrl_t *pcVar5;
  slot_type *psVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined8 uVar23;
  ctrl_t *pcVar24;
  size_t sVar25;
  ulong uVar26;
  byte bVar27;
  size_t hashval;
  size_t i;
  FindInfo FVar28;
  probe_seq<16UL> pStack_48;
  
  uVar4 = this->capacity_;
  if (uVar4 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar4 + 1 & uVar4) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar4 - (uVar4 >> 3) >> 1 < this->size_) {
    resize(this,uVar4 * 2 + 1);
    return;
  }
  uVar4 = this->capacity_;
  if ((uVar4 == 0) || ((uVar4 + 1 & uVar4) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
                 );
  }
  if (uVar4 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
                 );
  }
  pcVar5 = this->ctrl_;
  if (pcVar5[uVar4] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar24 = pcVar5 + uVar4;
  if (pcVar24 + 1 != pcVar5) {
    uVar26 = 0;
    do {
      pcVar1 = pcVar5 + uVar26;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar5 + uVar26);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      uVar26 = uVar26 + 0x10;
    } while (uVar4 + 1 != uVar26);
  }
  uVar23 = *(undefined8 *)(pcVar5 + 8);
  *(undefined8 *)(pcVar24 + 1) = *(undefined8 *)pcVar5;
  *(undefined8 *)(pcVar24 + 9) = uVar23;
  *pcVar24 = -1;
  sVar25 = this->capacity_;
  if (sVar25 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (long)this->slots_[i].i;
        hashval = SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar28 = find_first_non_full(this,hashval);
        sVar25 = FVar28.offset;
        probe(&pStack_48,this,hashval);
        uVar26 = sVar25 - pStack_48.offset_;
        uVar4 = this->capacity_;
        probe(&pStack_48,this,hashval);
        bVar27 = (byte)hashval;
        if ((i - pStack_48.offset_ & this->capacity_ ^ uVar26 & uVar4) < 0x10) {
          bVar27 = bVar27 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar25] == -2) {
            set_ctrl(this,sVar25,bVar27 & 0x7f);
            psVar6 = this->slots_;
            iVar3 = psVar6[i].i;
            psVar6[i].i = psVar6[sVar25].i;
            psVar6[sVar25].i = iVar3;
            i = i - 1;
            goto LAB_00128044;
          }
          if (this->ctrl_[sVar25] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
                         );
          }
          set_ctrl(this,sVar25,bVar27 & 0x7f);
          this->slots_[sVar25].i = this->slots_[i].i;
          bVar27 = 0x80;
        }
        set_ctrl(this,i,bVar27);
      }
LAB_00128044:
      i = i + 1;
      sVar25 = this->capacity_;
    } while (i != sVar25);
  }
  reset_growth_left(this,sVar25);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }